

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferBufferParameters.cpp
# Opt level: O0

GLboolean __thiscall
glcts::TextureBufferBufferParameters::queryBufferParameteriv
          (TextureBufferBufferParameters *this,GLenum target,GLenum pname,GLint expected_data)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestLog *this_00;
  MessageBuilder *pMVar3;
  MessageBuilder local_1b0;
  GLboolean local_2d;
  int local_2c;
  GLboolean test_passed;
  long lStack_28;
  GLint result;
  Functions *gl;
  GLenum local_18;
  GLint expected_data_local;
  GLenum pname_local;
  GLenum target_local;
  TextureBufferBufferParameters *this_local;
  
  gl._4_4_ = expected_data;
  local_18 = pname;
  expected_data_local = target;
  _pname_local = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_28 = CONCAT44(extraout_var,iVar1);
  local_2c = -1;
  local_2d = '\x01';
  (**(code **)(lStack_28 + 0x7a8))(expected_data_local,local_18,&local_2c);
  err = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(err,"Could not query for value of buffer object\'s parameter!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferBufferParameters.cpp"
                  ,0x74);
  if (local_2c != gl._4_4_) {
    local_2d = '\0';
    this_00 = tcu::TestContext::getLog
                        ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1b0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_1b0,(char (*) [33])"glGetBufferParameteriv(pname == ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_18);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [12])0x2c59534);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_2c);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [39])" which is not equal to expected value ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(int *)((long)&gl + 4));
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2b5e49a);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  }
  return local_2d;
}

Assistant:

glw::GLboolean TextureBufferBufferParameters::queryBufferParameteriv(glw::GLenum target, glw::GLenum pname,
																	 glw::GLint expected_data)
{
	/* Retrieve GLES entry points. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint	 result	  = -1;
	glw::GLboolean test_passed = true;

	gl.getBufferParameteriv(target, pname, &result);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not query for value of buffer object's parameter!");

	if (result != expected_data)
	{
		test_passed = false;

		m_testCtx.getLog() << tcu::TestLog::Message << "glGetBufferParameteriv(pname == " << pname << ") returned "
						   << result << " which is not equal to expected value " << expected_data << "."
						   << tcu::TestLog::EndMessage;
	}

	return test_passed;
}